

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level.cxx
# Opt level: O0

xr_build_lights * load<xray_re::xr_build_lights>(char *path,char *name,bool required)

{
  xr_build_lights *this;
  xr_build_lights *instance;
  xr_reader *r;
  xr_file_system *fs;
  char *pcStack_20;
  bool required_local;
  char *name_local;
  char *path_local;
  
  fs._7_1_ = required;
  pcStack_20 = name;
  name_local = path;
  r = (xr_reader *)xray_re::xr_file_system::instance();
  instance = (xr_build_lights *)
             xray_re::xr_file_system::r_open((xr_file_system *)r,name_local,pcStack_20);
  if (instance == (xr_build_lights *)0x0) {
    if ((fs._7_1_ & 1) != 0) {
      xray_re::msg("can\'t load %s",pcStack_20);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level.cxx"
                    ,0x84,"T *load(const char *, const char *, bool) [T = xray_re::xr_build_lights]"
                   );
    }
    path_local = (char *)0x0;
  }
  else {
    xray_re::msg("loading %s",pcStack_20);
    this = (xr_build_lights *)operator_new(0x50);
    xray_re::xr_build_lights::xr_build_lights(this,(xr_reader *)instance);
    xray_re::xr_file_system::r_close((xr_file_system *)r,(xr_reader **)&instance);
    path_local = (char *)this;
  }
  return (xr_build_lights *)path_local;
}

Assistant:

static T* load(const char* path, const char* name, bool required = false)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path, name);
	if (r) {
		msg("loading %s", name);
		T* instance = new T(*r);
		fs.r_close(r);
		return instance;
	} else if (required) {
		msg("can't load %s", name);
		xr_not_expected();
	}
	return 0;
}